

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O1

void ucnv_MBCSUnload(UConverterSharedData *sharedData)

{
  int32_t (*buffer) [256];
  UConverterSharedData *sharedData_00;
  uint8_t *buffer_00;
  
  buffer = (sharedData->mbcs).swapLFNLStateTable;
  if (buffer != (int32_t (*) [256])0x0) {
    uprv_free_63(buffer);
  }
  if ((sharedData->mbcs).stateTableOwned != '\0') {
    uprv_free_63((sharedData->mbcs).stateTable);
  }
  sharedData_00 = (sharedData->mbcs).baseSharedData;
  if (sharedData_00 != (UConverterSharedData *)0x0) {
    ucnv_unload_63(sharedData_00);
  }
  buffer_00 = (sharedData->mbcs).reconstitutedData;
  if (buffer_00 != (uint8_t *)0x0) {
    uprv_free_63(buffer_00);
    return;
  }
  return;
}

Assistant:

static void U_CALLCONV
ucnv_MBCSUnload(UConverterSharedData *sharedData) {
    UConverterMBCSTable *mbcsTable=&sharedData->mbcs;

    if(mbcsTable->swapLFNLStateTable!=NULL) {
        uprv_free(mbcsTable->swapLFNLStateTable);
    }
    if(mbcsTable->stateTableOwned) {
        uprv_free((void *)mbcsTable->stateTable);
    }
    if(mbcsTable->baseSharedData!=NULL) {
        ucnv_unload(mbcsTable->baseSharedData);
    }
    if(mbcsTable->reconstitutedData!=NULL) {
        uprv_free(mbcsTable->reconstitutedData);
    }
}